

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  size_t keylen;
  size_t outlen;
  size_t outlen_00;
  secp256k1_gej *psVar8;
  secp256k1_gej *psVar9;
  ulong uVar10;
  byte bVar11;
  secp256k1_fe s;
  secp256k1_scalar *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  secp256k1_scalar local_148;
  secp256k1_fe local_128;
  secp256k1_rfc6979_hmac_sha256 local_f4;
  secp256k1_gej local_b0;
  
  bVar11 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  if (seed32 == (uchar *)0x0) {
    (ctx->initial).infinity = 0;
    (ctx->initial).x.n[0] = 0x2815b16f81798;
    (ctx->initial).x.n[1] = 0xdb2dce28d959f;
    (ctx->initial).x.n[2] = 0xe870b07029bfc;
    (ctx->initial).x.n[3] = 0xbbac55a06295c;
    (ctx->initial).x.n[4] = 0x79be667ef9dc;
    (ctx->initial).y.n[0] = 0x7d08ffb10d4b8;
    (ctx->initial).y.n[1] = 0x48a68554199c4;
    (ctx->initial).y.n[2] = 0xe1108a8fd17b4;
    (ctx->initial).y.n[3] = 0xc4655da4fbfc0;
    (ctx->initial).y.n[4] = 0x483ada7726a3;
    (ctx->initial).z.n[0] = 1;
    (ctx->initial).z.n[1] = 0;
    (ctx->initial).z.n[2] = 0;
    (ctx->initial).z.n[3] = 0;
    (ctx->initial).z.n[4] = 0;
    secp256k1_gej_neg(&ctx->initial,&ctx->initial);
    (ctx->blind).d[0] = 1;
    (ctx->blind).d[1] = 0;
    (ctx->blind).d[2] = 0;
    (ctx->blind).d[3] = 0;
    secp256k1_scalar_get_b32((uchar *)&local_168,&ctx->blind);
    local_198 = local_158;
    uStack_190 = uStack_150;
    local_1a8 = local_168;
    uStack_1a0 = uStack_160;
    keylen = 0x20;
  }
  else {
    secp256k1_scalar_get_b32((uchar *)&local_168,&ctx->blind);
    local_198 = local_158;
    uStack_190 = uStack_150;
    local_1a8 = local_168;
    uStack_1a0 = uStack_160;
    local_188 = *(undefined8 *)seed32;
    uStack_180 = *(undefined8 *)(seed32 + 8);
    local_178 = *(undefined8 *)(seed32 + 0x10);
    uStack_170 = *(undefined8 *)(seed32 + 0x18);
    keylen = 0x40;
  }
  local_1b0 = &ctx->blind;
  secp256k1_rfc6979_hmac_sha256_initialize(&local_f4,(uchar *)&local_1a8,keylen);
  secp256k1_rfc6979_hmac_sha256_generate(&local_f4,(uchar *)&local_168,outlen);
  uVar6 = secp256k1_fe_set_b32(&local_128,(uchar *)&local_168);
  uVar10 = (ulong)((uint)(((local_128.n[2] == 0 && local_128.n[3] == 0) &&
                          (local_128.n[1] == 0 && local_128.n[0] == 0)) && local_128.n[4] == 0) |
                  uVar6 ^ 1);
  uVar1 = uVar10 - 1;
  local_128.n[0] = local_128.n[0] & uVar1 | uVar10;
  local_128.n[1] = local_128.n[1] & uVar1;
  local_128.n[2] = local_128.n[2] & uVar1;
  local_128.n[3] = local_128.n[3] & uVar1;
  local_128.n[4] = uVar1 & local_128.n[4];
  secp256k1_gej_rescale(&ctx->initial,&local_128);
  local_128.n[4] = 0;
  local_128.n[2] = 0;
  local_128.n[3] = 0;
  local_128.n[0] = 0;
  local_128.n[1] = 0;
  secp256k1_rfc6979_hmac_sha256_generate(&local_f4,(uchar *)&local_168,outlen_00);
  secp256k1_scalar_set_b32(&local_148,(uchar *)&local_168,(int *)0x0);
  bVar4 = local_148.d[3] == 0;
  bVar5 = local_148.d[0] == 0;
  bVar3 = local_148.d[1] == 0;
  bVar2 = local_148.d[2] == 0;
  if (((bVar4 && bVar5) && bVar3) && bVar2) {
    local_148.d[0] = 0;
  }
  if (((bVar4 && bVar5) && bVar3) && bVar2) {
    local_148.d[1] = 0;
  }
  local_148.d[0] = local_148.d[0] | (((bVar4 && bVar5) && bVar3) && bVar2);
  secp256k1_ecmult_gen(ctx,&local_b0,&local_148);
  secp256k1_scalar_negate(&local_148,&local_148);
  (ctx->blind).d[2] = local_148.d[2];
  (ctx->blind).d[3] = local_148.d[3];
  local_1b0->d[0] = local_148.d[0];
  (ctx->blind).d[1] = local_148.d[1];
  psVar8 = &local_b0;
  psVar9 = &ctx->initial;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar9->x).n[0] = (psVar8->x).n[0];
    psVar8 = (secp256k1_gej *)((long)psVar8 + (ulong)bVar11 * -0x10 + 8);
    psVar9 = (secp256k1_gej *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    int overflow;
    unsigned char keydata[64] = {0};
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(nonce32, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    memcpy(keydata, nonce32, 32);
    if (seed32 != NULL) {
        memcpy(keydata + 32, seed32, 32);
    }
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, seed32 ? 64 : 32);
    memset(keydata, 0, sizeof(keydata));
    /* Accept unobservably small non-uniformity. */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    overflow = !secp256k1_fe_set_b32(&s, nonce32);
    overflow |= secp256k1_fe_is_zero(&s);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, overflow);
    /* Randomize the projection to defend against multiplier sidechannels. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}